

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

void spvOptimizerSetMessageConsumer(spv_optimizer_t *optimizer,spv_message_consumer consumer)

{
  anon_class_8_1_c614a974 local_40;
  MessageConsumer local_38;
  spv_message_consumer local_18;
  spv_message_consumer consumer_local;
  spv_optimizer_t *optimizer_local;
  
  local_40.consumer = consumer;
  local_18 = consumer;
  consumer_local = (spv_message_consumer)optimizer;
  std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
  function<spvOptimizerSetMessageConsumer::__0,void>
            ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
             &local_38,&local_40);
  spvtools::Optimizer::SetMessageConsumer((Optimizer *)optimizer,&local_38);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_38);
  return;
}

Assistant:

SPIRV_TOOLS_EXPORT void spvOptimizerSetMessageConsumer(
    spv_optimizer_t* optimizer, spv_message_consumer consumer) {
  reinterpret_cast<spvtools::Optimizer*>(optimizer)->
      SetMessageConsumer(
          [consumer](spv_message_level_t level, const char* source,
                     const spv_position_t& position, const char* message) {
            return consumer(level, source, &position, message);
          });
}